

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void hexFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  Mem **ppMVar1;
  int iVar2;
  uchar c;
  char *z;
  char *zHex;
  uchar *pBlob;
  int n;
  int i;
  _func_void_void_ptr *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  byte in_stack_ffffffffffffffc7;
  undefined1 *nByte;
  sqlite3_context *z_00;
  sqlite3_context *psVar3;
  byte *local_28;
  int local_1c;
  
  psVar3 = (sqlite3_context *)&DAT_aaaaaaaaaaaaaaaa;
  nByte = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = (byte *)sqlite3_value_blob((sqlite3_value *)&DAT_aaaaaaaaaaaaaaaa);
  iVar2 = sqlite3_value_bytes((sqlite3_value *)0x224572);
  psVar3 = (sqlite3_context *)contextMalloc(psVar3,(i64)nByte);
  if (psVar3 != (sqlite3_context *)0x0) {
    z_00 = psVar3;
    for (local_1c = 0; local_1c < iVar2; local_1c = local_1c + 1) {
      in_stack_ffffffffffffffc7 = *local_28;
      ppMVar1 = &z_00->pOut;
      *(char *)&z_00->pOut = "0123456789ABCDEF"[(int)(uint)in_stack_ffffffffffffffc7 >> 4];
      z_00 = (sqlite3_context *)((long)&z_00->pOut + 2);
      *(char *)((long)ppMVar1 + 1) = "0123456789ABCDEF"[(int)(in_stack_ffffffffffffffc7 & 0xf)];
      local_28 = local_28 + 1;
    }
    *(undefined1 *)&z_00->pOut = 0;
    sqlite3_result_text64
              (psVar3,(char *)z_00,CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8,'\0');
  }
  return;
}

Assistant:

static void hexFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  int i, n;
  const unsigned char *pBlob;
  char *zHex, *z;
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  pBlob = sqlite3_value_blob(argv[0]);
  n = sqlite3_value_bytes(argv[0]);
  assert( pBlob==sqlite3_value_blob(argv[0]) );  /* No encoding change */
  z = zHex = contextMalloc(context, ((i64)n)*2 + 1);
  if( zHex ){
    for(i=0; i<n; i++, pBlob++){
      unsigned char c = *pBlob;
      *(z++) = hexdigits[(c>>4)&0xf];
      *(z++) = hexdigits[c&0xf];
    }
    *z = 0;
    sqlite3_result_text64(context, zHex, (u64)(z-zHex),
                          sqlite3_free, SQLITE_UTF8);
  }
}